

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.cpp
# Opt level: O2

unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> __thiscall
anon_unknown.dwarf_aea87::anon_func::OptimizeForJS::create(OptimizeForJS *this)

{
  OptimizeForJS *this_00;
  
  this_00 = (OptimizeForJS *)operator_new(0x130);
  memset(this_00,0,0x130);
  OptimizeForJS(this_00);
  (this->super_WalkerPass<wasm::PostWalker<OptimizeForJS,_wasm::Visitor<OptimizeForJS,_void>_>_>).
  super_Pass._vptr_Pass = (_func_int **)this_00;
  return (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)
         (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Pass> create() override {
      return std::make_unique<OptimizeForJS>();
    }